

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_param.c
# Opt level: O3

int condEvent(void *ptr,mpt_event *ev)

{
  mpt_message *pmVar1;
  int len;
  int iVar2;
  int code;
  mpt_metatype *pmVar3;
  char *pcVar4;
  mpt_reply_context *rc;
  mpt_config *cfg;
  mpt_message tmp;
  void *local_50;
  mpt_message local_48;
  
  if (ev == (mpt_event *)0x0) {
    if (ptr == (void *)0x0) {
      return 0;
    }
    (**(code **)(*ptr + 8))(ptr);
    return 0;
  }
  pmVar1 = ev->msg;
  if (pmVar1 == (mpt_message *)0x0) {
    rc = ev->reply;
    pcVar4 = "no default config assign";
  }
  else {
    local_48.used = pmVar1->used;
    local_48.base = pmVar1->base;
    local_48.cont = pmVar1->cont;
    local_48.clen = pmVar1->clen;
    len = getArg(&local_48,7,"mpt_dispatch_param.cond");
    if (len < 0) {
      return len;
    }
    pmVar3 = (mpt_metatype *)ptr;
    if ((ptr != (void *)0x0) ||
       (pmVar3 = mpt_config_global((mpt_path *)0x0), pmVar3 != (mpt_metatype *)0x0)) {
      local_50 = (void *)0x0;
      iVar2 = (*(pmVar3->_vptr->convertable).convert)((mpt_convertable *)pmVar3,0x85,&local_50);
      code = -4;
      if (local_50 != (void *)0x0 && -1 < iVar2) {
        code = mpt_message_assign(&local_48,len,condConfig,local_50);
      }
      if (ptr == (void *)0x0) {
        (*pmVar3->_vptr->unref)(pmVar3);
      }
      if (-1 < code) {
        if (code == 0) {
          pcVar4 = "keep config element";
        }
        else {
          pcVar4 = "assigned config element";
        }
        mpt_context_reply(ev->reply,0,"%s",pcVar4);
        return 0;
      }
      rc = ev->reply;
      pcVar4 = "failed to set global config";
      goto LAB_0011402d;
    }
    rc = ev->reply;
    pcVar4 = "no global config";
  }
  code = -2;
LAB_0011402d:
  mpt_context_reply(rc,code,"%s",pcVar4);
  ev->id = 0;
  return 3;
}

Assistant:

static int condEvent(void *ptr, MPT_STRUCT(event) *ev)
{
	static const char _func[] = "mpt_dispatch_param.cond";
	MPT_INTERFACE(metatype) *conf = ptr;
	MPT_INTERFACE(config) *cfg;
	MPT_STRUCT(message) tmp;
	int ret;
	
	if (!ev) {
		if (conf) {
			conf->_vptr->unref(conf);
		}
		return 0;
	}
	if (!ev->msg) {
		return MPT_event_fail(ev, MPT_ERROR(BadValue), MPT_tr("no default config assign"));
	}
	tmp = *ev->msg;
	if ((ret = getArg(&tmp, MPT_MESGTYPE(ParamCond), _func)) < 0) {
		return ret;
	}
	/* fallback to global config */
	if (!conf
	    && !(conf = mpt_config_global(0))) {
		return MPT_event_fail(ev, MPT_ERROR(BadValue), MPT_tr("no global config"));
	}
	/* require valid config for replace */
	cfg = 0;
	if (MPT_metatype_convert(conf, MPT_ENUM(TypeConfigPtr), &cfg) < 0
	    || !cfg) {
		ret = MPT_ERROR(BadOperation);
	} else {
		ret = mpt_message_assign(&tmp, ret, condConfig, cfg);
	}
	/* unref global config */
	if (!ptr) {
		conf->_vptr->unref(conf);
	}
	if (ret < 0) {
		return MPT_event_fail(ev, ret, MPT_tr("failed to set global config"));
	}
	if (!ret) {
		return MPT_event_good(ev, MPT_tr("keep config element"));
	}
	return MPT_event_good(ev, MPT_tr("assigned config element"));
}